

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  int *piVar2;
  Monitor monitor;
  _Any_data local_f8;
  code *local_e8;
  undefined8 uStack_e0;
  _Any_data local_d8;
  code *local_c8;
  code *local_c0;
  string local_b0;
  Monitor local_90;
  
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,".","");
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  local_c0 = std::
             _Function_handler<void_(DirMonitor::Event),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]DirMonitor/example.cpp:7:26)>
             ::_M_invoke;
  local_c8 = std::
             _Function_handler<void_(DirMonitor::Event),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]DirMonitor/example.cpp:7:26)>
             ::_M_manager;
  local_e8 = (code *)0x0;
  uStack_e0 = 0;
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  DirMonitor::Monitor::Monitor(&local_90,&local_b0,(OnFileHandle *)&local_d8,(Scheduler *)&local_f8)
  ;
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,__destroy_functor);
  }
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&local_d8,&local_d8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  do {
    local_f8._M_unused._M_member_pointer = 1;
    local_f8._8_8_ = 0;
    do {
      iVar1 = nanosleep((timespec *)&local_f8,(timespec *)&local_f8);
      if (iVar1 != -1) break;
      piVar2 = __errno_location();
    } while (*piVar2 == 4);
  } while( true );
}

Assistant:

int main() {
    Monitor monitor(".", [](const Event& event) {
        LOGI("Monitor: path:%s, type:%s, isAdd:%s",
                event.path.name.c_str(),
                event.path.isDir ? "dir" : "file",
                event.type == Event::Type::ADD ? "add" : "remove"
                );
    });
    for(;;) { std::this_thread::sleep_for(std::chrono::seconds(1)); };
    return 0;
}